

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

bool __thiscall
deqp::gls::MultiVertexArrayTest::isUnalignedBufferStrideTest(MultiVertexArrayTest *this)

{
  InputType IVar1;
  ulong uVar2;
  pointer pAVar3;
  ulong uVar4;
  int iVar5;
  
  pAVar3 = (this->m_spec).arrays.
           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 6;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    if (pAVar3->storage == STORAGE_BUFFER) {
      IVar1 = pAVar3->inputType;
      if ((IVar1 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) || (IVar1 == INPUTTYPE_INT_2_10_10_10)) {
        iVar5 = 4;
      }
      else {
        iVar5 = Array::inputTypeSize::size[(int)IVar1];
      }
      if (pAVar3->stride % iVar5 != 0) break;
    }
    pAVar3 = pAVar3 + 1;
  }
  return uVar4 < uVar2;
}

Assistant:

bool MultiVertexArrayTest::isUnalignedBufferStrideTest (void) const
{
	// Buffer strides should be data type size aligned
	for (size_t i = 0; i < m_spec.arrays.size(); ++i)
	{
		if (m_spec.arrays[i].storage == Array::STORAGE_BUFFER)
		{
			const bool inputTypePacked = m_spec.arrays[i].inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_spec.arrays[i].inputType == Array::INPUTTYPE_INT_2_10_10_10;

			int dataTypeSize = Array::inputTypeSize(m_spec.arrays[i].inputType);
			if (inputTypePacked)
				dataTypeSize = 4;

			if (m_spec.arrays[i].stride % dataTypeSize != 0)
				return true;
		}
	}

	return false;
}